

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlPushMatrix(void)

{
  if (0x1f < RLGL.State.stackCounter) {
    TraceLog(5,"RLGL: Matrix stack overflow (MAX_MATRIX_STACK_SIZE)");
  }
  if (RLGL.State.currentMatrixMode == 0x1700) {
    RLGL.State.transformRequired = true;
    RLGL.State.currentMatrix = &RLGL.State.transform;
  }
  memcpy(RLGL.State.stack + RLGL.State.stackCounter,RLGL.State.currentMatrix,0x40);
  RLGL.State.stackCounter = RLGL.State.stackCounter + 1;
  return;
}

Assistant:

void rlPushMatrix(void)
{
    if (RLGL.State.stackCounter >= MAX_MATRIX_STACK_SIZE) TRACELOG(LOG_ERROR, "RLGL: Matrix stack overflow (MAX_MATRIX_STACK_SIZE)");

    if (RLGL.State.currentMatrixMode == RL_MODELVIEW)
    {
        RLGL.State.transformRequired = true;
        RLGL.State.currentMatrix = &RLGL.State.transform;
    }

    RLGL.State.stack[RLGL.State.stackCounter] = *RLGL.State.currentMatrix;
    RLGL.State.stackCounter++;
}